

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRT_builder_main.cpp
# Opt level: O1

SymbolTableRes * constructSymbolTable(SymbolTableRes *__return_storage_ptr__,CProgram *program)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  pointer pCVar1;
  pointer pCVar2;
  CConstructSymbolTableVisitor symbol_table_visitor;
  vector<CError,_std::allocator<CError>_> local_88;
  CConstructSymbolTableVisitor local_70;
  vector<CError,_std::allocator<CError>_> local_30;
  
  CConstructSymbolTableVisitor::CConstructSymbolTableVisitor(&local_70);
  (**(program->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)(program,&local_70);
  (__return_storage_ptr__->errors).super__Vector_base<CError,_std::allocator<CError>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->errors).super__Vector_base<CError,_std::allocator<CError>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->symbolTable).super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->symbolTable).super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->errors).super__Vector_base<CError,_std::allocator<CError>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CConstructSymbolTableVisitor::GetSymbolTable(&local_70);
  pCVar2 = local_88.super__Vector_base<CError,_std::allocator<CError>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pCVar1 = local_88.super__Vector_base<CError,_std::allocator<CError>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_88.super__Vector_base<CError,_std::allocator<CError>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<CError,_std::allocator<CError>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this = (__return_storage_ptr__->symbolTable).
         super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (__return_storage_ptr__->symbolTable).super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)pCVar1;
  (__return_storage_ptr__->symbolTable).super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCVar2;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  if (local_88.super__Vector_base<CError,_std::allocator<CError>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_88.super__Vector_base<CError,_std::allocator<CError>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  CConstructSymbolTableVisitor::GetErrors(&local_30,&local_70);
  local_88.super__Vector_base<CError,_std::allocator<CError>_>._M_impl.super__Vector_impl_data.
  _M_start = (__return_storage_ptr__->errors).super__Vector_base<CError,_std::allocator<CError>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_88.super__Vector_base<CError,_std::allocator<CError>_>._M_impl.super__Vector_impl_data.
  _M_finish = (__return_storage_ptr__->errors).super__Vector_base<CError,_std::allocator<CError>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  local_88.super__Vector_base<CError,_std::allocator<CError>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (__return_storage_ptr__->errors).super__Vector_base<CError,_std::allocator<CError>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->errors).super__Vector_base<CError,_std::allocator<CError>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_30.super__Vector_base<CError,_std::allocator<CError>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (__return_storage_ptr__->errors).super__Vector_base<CError,_std::allocator<CError>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_30.super__Vector_base<CError,_std::allocator<CError>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (__return_storage_ptr__->errors).super__Vector_base<CError,_std::allocator<CError>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_30.super__Vector_base<CError,_std::allocator<CError>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_30.super__Vector_base<CError,_std::allocator<CError>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_30.super__Vector_base<CError,_std::allocator<CError>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_30.super__Vector_base<CError,_std::allocator<CError>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<CError,_std::allocator<CError>_>::~vector(&local_88);
  std::vector<CError,_std::allocator<CError>_>::~vector(&local_30);
  local_70.super_IVisitor._vptr_IVisitor = (_func_int **)&PTR_Visit_00182a00;
  std::vector<CError,_std::allocator<CError>_>::~vector(&local_70.errors);
  if (local_70.info.super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.info.super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_70.table.super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.table.super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

SymbolTableRes constructSymbolTable( CProgram *program ) {
    CConstructSymbolTableVisitor symbol_table_visitor = CConstructSymbolTableVisitor( );
    program->Accept( symbol_table_visitor );

    SymbolTableRes res;
    res.symbolTable = symbol_table_visitor.GetSymbolTable( );
    res.errors = symbol_table_visitor.GetErrors( );

    return res;
}